

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::keyPressEvent(QLineEdit *this,QKeyEvent *event)

{
  bool bVar1;
  QEvent *in_RSI;
  QWidgetLineControl *in_RDI;
  QLineEditPrivate *d;
  QKeyEvent *in_stack_00000060;
  QWidgetLineControl *in_stack_00000068;
  
  d_func((QLineEdit *)0x5c686c);
  QWidgetLineControl::processKeyEvent(in_stack_00000068,in_stack_00000060);
  bVar1 = QEvent::isAccepted(in_RSI);
  if (bVar1) {
    QWidgetLineControl::updateCursorBlinking(in_RDI);
  }
  return;
}

Assistant:

void QLineEdit::keyPressEvent(QKeyEvent *event)
{
    Q_D(QLineEdit);
    #ifdef QT_KEYPAD_NAVIGATION
    bool select = false;
    switch (event->key()) {
        case Qt::Key_Select:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (hasEditFocus()) {
                    setEditFocus(false);
                    if (d->control->completer() && d->control->completer()->popup()->isVisible())
                        d->control->completer()->popup()->hide();
                    select = true;
                }
            }
            break;
        case Qt::Key_Back:
        case Qt::Key_No:
            if (!QApplicationPrivate::keypadNavigationEnabled() || !hasEditFocus()) {
                event->ignore();
                return;
            }
            break;
        default:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!hasEditFocus() && !(event->modifiers() & Qt::ControlModifier)) {
                    if (!event->text().isEmpty() && event->text().at(0).isPrint()
                        && !isReadOnly())
                        setEditFocus(true);
                    else {
                        event->ignore();
                        return;
                    }
                }
            }
    }



    if (QApplicationPrivate::keypadNavigationEnabled() && !select && !hasEditFocus()) {
        setEditFocus(true);
        if (event->key() == Qt::Key_Select)
            return; // Just start. No action.
    }
#endif
    d->control->processKeyEvent(event);
    if (event->isAccepted())
        d->control->updateCursorBlinking();
}